

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O2

void stbiw__write_pixel(stbi__write_context *s,int rgb_dir,int comp,int write_alpha,int expand_mono,
                       uchar *d)

{
  byte bVar1;
  undefined8 in_RAX;
  long lVar2;
  undefined4 in_register_00000084;
  uchar *puVar3;
  uchar px [3];
  uchar local_23 [3];
  
  puVar3 = (uchar *)CONCAT44(in_register_00000084,expand_mono);
  if (rgb_dir - 1U < 2) {
    local_23[2] = *puVar3;
    local_23[0] = local_23[2];
    local_23[1] = local_23[2];
    if (write_alpha == 0) {
      stbiw__write1(s,local_23[2]);
      goto LAB_00104ba1;
    }
  }
  else {
    if (rgb_dir != 3) {
      if (rgb_dir != 4) goto LAB_00104ba1;
      if (comp == 0) {
        bVar1 = puVar3[3];
        for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
          local_23[lVar2] =
               (char)((int)(((uint)puVar3[lVar2] - (uint)(byte)(&DAT_00106264)[lVar2]) * (uint)bVar1
                           ) / 0xff) + (&DAT_00106264)[lVar2];
        }
        local_23[2] = (uchar)((ulong)in_RAX >> 0x38);
        local_23[1] = (uchar)((ulong)in_RAX >> 0x30);
        local_23[0] = (uchar)((ulong)in_RAX >> 0x28);
        goto LAB_00104b9c;
      }
    }
    local_23[2] = puVar3[2];
    local_23[1] = puVar3[1];
    local_23[0] = *puVar3;
  }
LAB_00104b9c:
  stbiw__write3(s,local_23[2],local_23[1],local_23[0]);
LAB_00104ba1:
  if (comp < 1) {
    return;
  }
  stbiw__write1(s,puVar3[(long)rgb_dir + -1]);
  return;
}

Assistant:

static void stbiw__write_pixel(stbi__write_context *s, int rgb_dir, int comp, int write_alpha, int expand_mono, unsigned char *d)
{
   unsigned char bg[3] = { 255, 0, 255}, px[3];
   int k;

   if (write_alpha < 0)
      stbiw__write1(s, d[comp - 1]);

   switch (comp) {
      case 2: // 2 pixels = mono + alpha, alpha is written separately, so same as 1-channel case
      case 1:
         if (expand_mono)
            stbiw__write3(s, d[0], d[0], d[0]); // monochrome bmp
         else
            stbiw__write1(s, d[0]);  // monochrome TGA
         break;
      case 4:
         if (!write_alpha) {
            // composite against pink background
            for (k = 0; k < 3; ++k)
               px[k] = bg[k] + ((d[k] - bg[k]) * d[3]) / 255;
            stbiw__write3(s, px[1 - rgb_dir], px[1], px[1 + rgb_dir]);
            break;
         }
         /* FALLTHROUGH */
      case 3:
         stbiw__write3(s, d[1 - rgb_dir], d[1], d[1 + rgb_dir]);
         break;
   }
   if (write_alpha > 0)
      stbiw__write1(s, d[comp - 1]);
}